

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> * __thiscall
kj::anon_unknown_36::WebSocketImpl::ZlibContext::processMessage
          (OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *__return_storage_ptr__,
          ZlibContext *this,ArrayPtr<const_unsigned_char> message,Maybe<unsigned_long> *maxSize,
          bool addNullTerminator)

{
  bool bVar1;
  RemoveConst<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *pRVar2;
  int iVar3;
  ArrayDisposer *pAVar4;
  size_t sVar5;
  Result *part;
  ulong uVar6;
  Result *pRVar7;
  uchar *puVar8;
  size_t sVar9;
  Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *dataParts;
  ulong uVar10;
  Result *part_1;
  ulong capacity;
  long lVar11;
  bool _kjCondition;
  int local_15c;
  char local_155;
  int result;
  RemoveConst<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *local_150;
  ArrayDisposer *local_148;
  size_t currentIndex;
  anon_union_32_1_a8a2e026_for_OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>_2
  local_138;
  Fault f;
  Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> output;
  Array<unsigned_char> buffer;
  Array<unsigned_char> processedMessage;
  Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> parts;
  ulong local_68;
  NullableValue<kj::OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>_>
  _kj_switch_subject;
  
  (this->ctx).next_in = message.ptr;
  (this->ctx).avail_in = (uInt)message.size_;
  parts.builder.ptr = (Result *)0x0;
  parts.builder.pos =
       (RemoveConst<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)0x0;
  parts.builder.endPtr = (Result *)0x0;
  parts.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_155 = (maxSize->ptr).isSet;
  if ((bool)local_155 == true) {
    local_68 = (maxSize->ptr).field_1.value;
  }
  output.builder.ptr = (Result *)0x0;
  output.builder.pos =
       (RemoveConst<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)0x0;
  output.builder.endPtr = (Result *)0x0;
  output.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  uVar10 = 0;
  do {
    buffer.ptr = kj::_::HeapArrayDisposer::allocate<unsigned_char>(0x1000);
    buffer.size_ = 0x1000;
    buffer.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    (this->ctx).next_out = buffer.ptr;
    (this->ctx).avail_out = 0x1000;
    result = 0;
    if (this->mode == DECOMPRESS) {
      result = inflate(&this->ctx);
      _kjCondition = (uint)result < 2 || result == 0xfffffffb;
      if ((6 < result + 5U) || ((0x61U >> (result + 5U & 0x1f) & 1) == 0)) {
        currentIndex = CONCAT44(currentIndex._4_4_,local_15c);
        local_138._8_8_ = local_150;
        local_138._24_8_ = local_148;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,bool&,char_const(&)[21],int&,char_const(&)[13],char*&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0xd2f,FAILED,"result == Z_OK || result == Z_BUF_ERROR || result == Z_STREAM_END"
                   ,"_kjCondition,\"Decompression failed\", result, \" with reason\", ctx.msg",
                   &_kjCondition,(char (*) [21])"Decompression failed",&result,
                   (char (*) [13])" with reason",&(this->ctx).msg);
        kj::_::Debug::Fault::fatal(&f);
      }
    }
    else if (this->mode == COMPRESS) {
      result = deflate(&this->ctx);
      _kjCondition = (uint)result < 2 || result == 0xfffffffb;
      if ((6 < result + 5U) || ((0x61U >> (result + 5U & 0x1f) & 1) == 0)) {
        currentIndex = CONCAT44(currentIndex._4_4_,local_15c);
        local_138._8_8_ = local_150;
        local_138._24_8_ = local_148;
        kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[19],int&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0xd2a,FAILED,"result == Z_OK || result == Z_BUF_ERROR || result == Z_STREAM_END"
                   ,"_kjCondition,\"Compression failed\", result",&_kjCondition,
                   (char (*) [19])"Compression failed",&result);
        kj::_::Debug::Fault::fatal(&f);
      }
    }
    pAVar4 = buffer.disposer;
    processedMessage.ptr = (uchar *)CONCAT44(processedMessage.ptr._4_4_,result);
    processedMessage.size_ = (size_t)buffer.ptr;
    processedMessage.disposer = (ArrayDisposer *)buffer.size_;
    buffer.ptr = (uchar *)0x0;
    buffer.size_ = 0;
    sVar9 = 0x1000 - (ulong)(this->ctx).avail_out;
    Array<unsigned_char>::~Array(&buffer);
    iVar3 = (int)processedMessage.ptr;
    if (sVar9 == 0) {
LAB_00370f9a:
      if ((this->ctx).avail_in == 0) {
        bVar1 = true;
        if (iVar3 == 1 || (this->ctx).avail_out != 0) {
          if (iVar3 == 1) goto LAB_00370fc8;
          goto LAB_00370fd0;
        }
      }
      else {
        bVar1 = true;
        if (iVar3 == 1) {
LAB_00370fc8:
          reset(this);
LAB_00370fd0:
          local_138._16_8_ = output.builder.endPtr;
          local_150 = output.builder.pos;
          local_138._0_8_ = output.builder.ptr;
          local_148 = output.builder.disposer;
          output.builder.endPtr = (Result *)0x0;
          output.builder.ptr = (Result *)0x0;
          output.builder.pos =
               (RemoveConst<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)0x0;
          local_15c = 1;
          goto LAB_0037100b;
        }
      }
    }
    else {
      if (output.builder.pos == output.builder.endPtr) {
        uVar6 = ((long)output.builder.pos - (long)output.builder.ptr) / 0x28;
        capacity = uVar6 * 2;
        if (output.builder.pos == output.builder.ptr) {
          capacity = 4;
        }
        if (capacity < uVar6) {
          pRVar7 = output.builder.ptr + capacity;
          while (pRVar7 < output.builder.pos) {
            pRVar2 = output.builder.pos + -1;
            output.builder.pos = output.builder.pos + -1;
            Array<const_unsigned_char>::~Array(&pRVar2->buffer);
          }
        }
        buffer.ptr = (uchar *)kj::_::HeapArrayDisposer::allocateImpl
                                        (0x28,0,capacity,(_func_void_void_ptr *)0x0,
                                         (_func_void_void_ptr *)0x0);
        buffer.disposer = (ArrayDisposer *)((long)buffer.ptr + capacity * 10 * 4);
        buffer.size_ = (size_t)buffer.ptr;
        for (pRVar7 = output.builder.ptr; pRVar7 != output.builder.pos; pRVar7 = pRVar7 + 1) {
          *(int *)buffer.size_ = pRVar7->processResult;
          *(uchar **)(buffer.size_ + 8) = (pRVar7->buffer).ptr;
          *(size_t *)(buffer.size_ + 0x10) = (pRVar7->buffer).size_;
          *(ArrayDisposer **)(buffer.size_ + 0x18) = (pRVar7->buffer).disposer;
          (pRVar7->buffer).ptr = (uchar *)0x0;
          (pRVar7->buffer).size_ = 0;
          *(size_t *)(buffer.size_ + 0x20) = pRVar7->size;
          buffer.size_ = buffer.size_ + 0x28;
        }
        ArrayBuilder<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::operator=
                  (&output.builder,
                   (ArrayBuilder<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)
                   &buffer);
        ArrayBuilder<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::dispose
                  ((ArrayBuilder<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)
                   &buffer);
      }
      (output.builder.pos)->processResult = (int)processedMessage.ptr;
      ((output.builder.pos)->buffer).ptr = (uchar *)processedMessage.size_;
      ((output.builder.pos)->buffer).size_ = (size_t)processedMessage.disposer;
      ((output.builder.pos)->buffer).disposer = pAVar4;
      processedMessage.size_ = 0;
      processedMessage.disposer = (ArrayDisposer *)0x0;
      (output.builder.pos)->size = sVar9;
      output.builder.pos = output.builder.pos + 1;
      uVar10 = sVar9 + uVar10;
      if ((local_155 == '\0') || (uVar10 <= local_68)) goto LAB_00370f9a;
      local_138._0_4_ = 0x3f1;
      local_138._16_8_ = (Result *)0x15;
      local_150 = (RemoveConst<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)
                  0x4d65b4;
      local_15c = 2;
LAB_0037100b:
      bVar1 = false;
    }
    Array<const_unsigned_char>::~Array((Array<const_unsigned_char> *)&processedMessage.size_);
    pAVar4 = local_148;
    pRVar2 = local_150;
    iVar3 = local_15c;
    if (!bVar1) {
      currentIndex = CONCAT44(currentIndex._4_4_,local_15c);
      local_138._8_8_ = local_150;
      local_138._24_8_ = local_148;
      ArrayBuilder<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::dispose
                (&output.builder);
      _kj_switch_subject.isSet = true;
      _kj_switch_subject.field_1.value.tag = iVar3;
      if (iVar3 == 2) {
        _kj_switch_subject.field_1._24_8_ = local_138._16_8_;
        _kj_switch_subject.field_1._8_8_ = local_138._0_8_;
        _kj_switch_subject.field_1._16_8_ = local_138._8_8_;
        OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
        ::~OneOf((OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
                  *)&currentIndex);
        __return_storage_ptr__->tag = 2;
        *(undefined8 *)&__return_storage_ptr__->field_1 = _kj_switch_subject.field_1._8_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 8) =
             _kj_switch_subject.field_1._16_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) =
             _kj_switch_subject.field_1._24_8_;
        kj::_::
        NullableValue<kj::OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>_>
        ::~NullableValue(&_kj_switch_subject);
      }
      else {
        if (iVar3 == 1) {
          _kj_switch_subject.field_1._8_8_ = local_138._0_8_;
          _kj_switch_subject.field_1._16_8_ = pRVar2;
          _kj_switch_subject.field_1._24_8_ = local_138._16_8_;
          _kj_switch_subject.field_1._32_8_ = pAVar4;
          local_138._0_8_ = (Result *)0x0;
          local_138._8_8_ =
               (RemoveConst<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)0x0;
          local_138._16_8_ = (Result *)0x0;
          OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
          ::~OneOf((OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
                    *)&currentIndex);
          ArrayBuilder<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::operator=
                    (&parts.builder,
                     (ArrayBuilder<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result> *)
                     &_kj_switch_subject.field_1.value.field_1);
        }
        else {
          OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
          ::~OneOf((OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>
                    *)&currentIndex);
        }
        kj::_::
        NullableValue<kj::OneOf<kj::Vector<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>,_kj::WebSocket::ProtocolError>_>
        ::~NullableValue(&_kj_switch_subject);
        lVar11 = 0;
        for (pRVar7 = parts.builder.ptr; pRVar7 != parts.builder.pos; pRVar7 = pRVar7 + 1) {
          lVar11 = lVar11 + pRVar7->size;
        }
        sVar9 = lVar11 + (ulong)addNullTerminator;
        puVar8 = kj::_::HeapArrayDisposer::allocate<unsigned_char>(sVar9);
        pRVar2 = parts.builder.pos;
        currentIndex = 0;
        processedMessage.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
        processedMessage.ptr = puVar8;
        processedMessage.size_ = sVar9;
        for (pRVar7 = parts.builder.ptr; sVar5 = currentIndex, pRVar7 != pRVar2; pRVar7 = pRVar7 + 1
            ) {
          memcpy(puVar8 + currentIndex,(pRVar7->buffer).ptr,pRVar7->size);
          currentIndex = sVar5 + pRVar7->size;
        }
        if (addNullTerminator) {
          puVar8[currentIndex] = '\0';
          currentIndex = currentIndex + 1;
        }
        _kj_switch_subject._0_8_ = &currentIndex;
        _kj_switch_subject.field_1._8_8_ = anon_var_dwarf_3d166;
        _kj_switch_subject.field_1._16_8_ = 5;
        _kj_switch_subject.field_1._24_1_ = currentIndex == sVar9;
        _kj_switch_subject.field_1._0_8_ = sVar9;
        if (currentIndex != sVar9) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&>
                    ((Fault *)&buffer,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                     ,0xd00,FAILED,"currentIndex == processedMessage.size()","_kjCondition,",
                     (DebugComparison<unsigned_long_&,_unsigned_long> *)&_kj_switch_subject);
          kj::_::Debug::Fault::fatal((Fault *)&buffer);
        }
        __return_storage_ptr__->tag = 1;
        *(uchar **)&__return_storage_ptr__->field_1 = puVar8;
        *(size_t *)((long)&__return_storage_ptr__->field_1 + 8) = sVar9;
        *(undefined8 **)((long)&__return_storage_ptr__->field_1 + 0x10) =
             &kj::_::HeapArrayDisposer::instance;
        processedMessage.ptr = (uchar *)0x0;
        processedMessage.size_ = 0;
        Array<unsigned_char>::~Array(&processedMessage);
      }
      ArrayBuilder<kj::(anonymous_namespace)::WebSocketImpl::ZlibContext::Result>::dispose
                (&parts.builder);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

kj::OneOf<kj::Array<kj::byte>, ProtocolError> processMessage(kj::ArrayPtr<const byte> message,
        kj::Maybe<size_t> maxSize = kj::none,
        bool addNullTerminator = false) {
      // If `this` is the compressor, calling `processMessage()` will compress the `message`.
      // Likewise, if `this` is the decompressor, `processMessage()` will decompress the `message`.
      //
      // `maxSize` is only passed in when decompressing, since we want to ensure the decompressed
      // message is smaller than the `maxSize` passed to `receive()`.
      //
      // If (de)compression is successful, the result is returned as a Vector, otherwise,
      // an Exception is thrown.

      ctx.next_in = const_cast<byte*>(reinterpret_cast<const byte*>(message.begin()));
      ctx.avail_in = message.size();

      kj::Vector<Result> parts;
      KJ_SWITCH_ONEOF(processLoop(maxSize)) {
        KJ_CASE_ONEOF(protocolError, ProtocolError) {
          return kj::mv(protocolError);
        }
        KJ_CASE_ONEOF(dataParts, kj::Vector<Result>) {
          parts = kj::mv(dataParts);
        }
      }

      size_t amountToAllocate = 0;
      for (const auto& part : parts) {
        amountToAllocate += part.size;
      }

      if (addNullTerminator) {
        // Add space for the null-terminator.
        amountToAllocate += 1;
      }

      kj::Array<kj::byte> processedMessage = kj::heapArray<kj::byte>(amountToAllocate);
      size_t currentIndex = 0; // Current index into processedMessage.
      for (const auto& part : parts) {
        memcpy(&processedMessage[currentIndex], part.buffer.begin(), part.size);
        // We need to use `part.size` to determine the number of useful bytes, since data after
        // `part.size` is unused (and probably junk).
        currentIndex += part.size;
      }

      if (addNullTerminator) {
        processedMessage[currentIndex++] = '\0';
      }

      KJ_ASSERT(currentIndex == processedMessage.size());

      return kj::mv(processedMessage);
    }